

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_cmp
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey0,secp256k1_pubkey *pubkey1)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  secp256k1_pubkey **ppsVar5;
  long lVar6;
  ulong heap_size;
  bool bVar7;
  _func_int_void_ptr_void_ptr_void_ptr *in_R8;
  void *in_R9;
  ulong uVar8;
  byte *pbVar9;
  bool bVar10;
  size_t out_size;
  uchar out [2] [33];
  size_t local_90;
  secp256k1_pubkey *local_88;
  secp256k1_pubkey *local_80;
  byte local_78 [32];
  byte local_58 [40];
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_pubkey_cmp_cold_1();
    if (ctx == (secp256k1_context *)0x0) {
      secp256k1_ec_pubkey_sort_cold_2();
    }
    else if (pubkey0 != (secp256k1_pubkey *)0x0) {
      if (heap_size < 2) {
        return 1;
      }
      uVar8 = heap_size >> 1;
      do {
        uVar8 = uVar8 - 1;
        secp256k1_heap_down(pubkey0->data,uVar8,heap_size,(size_t)ctx,in_R8,in_R9);
        uVar2 = heap_size;
      } while (uVar8 != 0);
      do {
        uVar8 = uVar2 - 1;
        uVar1 = *(undefined8 *)pubkey0->data;
        *(undefined8 *)pubkey0->data = *(undefined8 *)(pubkey0->data + uVar2 * 8 + -8);
        *(undefined8 *)(pubkey0->data + uVar2 * 8 + -8) = uVar1;
        secp256k1_heap_down(pubkey0->data,0,uVar8,(size_t)ctx,in_R8,in_R9);
        uVar2 = uVar8;
      } while (1 < uVar8);
      return 1;
    }
    secp256k1_ec_pubkey_sort_cold_1();
    return 0;
  }
  local_88 = pubkey0;
  local_80 = pubkey1;
  ppsVar5 = &local_88;
  pbVar9 = local_78;
  bVar10 = true;
  do {
    bVar7 = bVar10;
    local_90 = 0x21;
    iVar4 = secp256k1_ec_pubkey_serialize(ctx,pbVar9,&local_90,*ppsVar5,0x102);
    if (iVar4 == 0) {
      pbVar9[0x10] = 0;
      pbVar9[0x11] = 0;
      pbVar9[0x12] = 0;
      pbVar9[0x13] = 0;
      pbVar9[0x14] = 0;
      pbVar9[0x15] = 0;
      pbVar9[0x16] = 0;
      pbVar9[0x17] = 0;
      pbVar9[0x18] = 0;
      pbVar9[0x19] = 0;
      pbVar9[0x1a] = 0;
      pbVar9[0x1b] = 0;
      pbVar9[0x1c] = 0;
      pbVar9[0x1d] = 0;
      pbVar9[0x1e] = 0;
      pbVar9[0x1f] = 0;
      pbVar9[0] = 0;
      pbVar9[1] = 0;
      pbVar9[2] = 0;
      pbVar9[3] = 0;
      pbVar9[4] = 0;
      pbVar9[5] = 0;
      pbVar9[6] = 0;
      pbVar9[7] = 0;
      pbVar9[8] = 0;
      pbVar9[9] = 0;
      pbVar9[10] = 0;
      pbVar9[0xb] = 0;
      pbVar9[0xc] = 0;
      pbVar9[0xd] = 0;
      pbVar9[0xe] = 0;
      pbVar9[0xf] = 0;
      pbVar9[0x20] = 0;
    }
    ppsVar5 = &local_80;
    pbVar9 = local_58 + 1;
    bVar10 = false;
  } while (bVar7);
  lVar6 = 0;
  do {
    pbVar9 = local_78 + lVar6;
    lVar3 = lVar6 + 1;
    if (*pbVar9 != local_58[lVar3]) break;
    bVar10 = lVar6 != 0x20;
    lVar6 = lVar6 + 1;
  } while (bVar10);
  return (uint)*pbVar9 - (uint)local_58[lVar3];
}

Assistant:

int secp256k1_ec_pubkey_cmp(const secp256k1_context* ctx, const secp256k1_pubkey* pubkey0, const secp256k1_pubkey* pubkey1) {
    unsigned char out[2][33];
    const secp256k1_pubkey* pk[2];
    int i;

    VERIFY_CHECK(ctx != NULL);
    pk[0] = pubkey0; pk[1] = pubkey1;
    for (i = 0; i < 2; i++) {
        size_t out_size = sizeof(out[i]);
        /* If the public key is NULL or invalid, ec_pubkey_serialize will call
         * the illegal_callback and return 0. In that case we will serialize the
         * key as all zeros which is less than any valid public key. This
         * results in consistent comparisons even if NULL or invalid pubkeys are
         * involved and prevents edge cases such as sorting algorithms that use
         * this function and do not terminate as a result. */
        if (!secp256k1_ec_pubkey_serialize(ctx, out[i], &out_size, pk[i], SECP256K1_EC_COMPRESSED)) {
            /* Note that ec_pubkey_serialize should already set the output to
             * zero in that case, but it's not guaranteed by the API, we can't
             * test it and writing a VERIFY_CHECK is more complex than
             * explicitly memsetting (again). */
            memset(out[i], 0, sizeof(out[i]));
        }
    }
    return secp256k1_memcmp_var(out[0], out[1], sizeof(out[0]));
}